

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::CheckFinalCounterValue
          (SACSubcaseBase *this,GLuint buffer,GLintptr offset,GLuint expected_value)

{
  bool bVar1;
  uint local_30;
  GLuint local_2c;
  GLuint value;
  GLuint expected_value_local;
  GLintptr offset_local;
  SACSubcaseBase *pSStack_18;
  GLuint buffer_local;
  SACSubcaseBase *this_local;
  
  local_2c = expected_value;
  _value = offset;
  offset_local._4_4_ = buffer;
  pSStack_18 = this;
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x92c0,buffer);
  glu::CallLogWrapper::glGetBufferSubData
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x92c0,_value,4,
             &local_30);
  bVar1 = local_30 == local_2c;
  if (!bVar1) {
    anon_unknown_0::Output("Counter value is %u should be %u.\n",(ulong)local_30,(ulong)local_2c);
  }
  return bVar1;
}

Assistant:

bool CheckFinalCounterValue(GLuint buffer, GLintptr offset, GLuint expected_value)
	{
		GLuint value;
		glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, buffer);
		glGetBufferSubData(GL_ATOMIC_COUNTER_BUFFER, offset, 4, &value);
		if (value != expected_value)
		{
			Output("Counter value is %u should be %u.\n", value, expected_value);
			return false;
		}
		return true;
	}